

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_inv_txfm_avx2.c
# Opt level: O2

void iidentity_row_16xn_avx2
               (__m256i *out,int32_t *input,int stride,int shift,int height,int txw_idx,
               int rect_type)

{
  undefined2 uVar1;
  undefined1 auVar2 [32];
  undefined1 auVar3 [32];
  long lVar4;
  int32_t *input_row;
  uint uVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  
  uVar1 = (undefined2)NewSqrt2list[height];
  auVar6._2_2_ = uVar1;
  auVar6._0_2_ = uVar1;
  auVar6._4_2_ = uVar1;
  auVar6._6_2_ = uVar1;
  auVar6._8_2_ = uVar1;
  auVar6._10_2_ = uVar1;
  auVar6._12_2_ = uVar1;
  auVar6._14_2_ = uVar1;
  uVar5 = 0xc - shift;
  auVar6 = vpunpcklwd_avx(auVar6,ZEXT416((1 << (0xbU - (char)shift & 0x1f)) + 0x800));
  auVar7._0_4_ = auVar6._0_4_;
  auVar7._4_4_ = auVar7._0_4_;
  auVar7._8_4_ = auVar7._0_4_;
  auVar7._12_4_ = auVar7._0_4_;
  auVar7._16_4_ = auVar7._0_4_;
  auVar7._20_4_ = auVar7._0_4_;
  auVar7._24_4_ = auVar7._0_4_;
  auVar7._28_4_ = auVar7._0_4_;
  if ((txw_idx == -1) || (txw_idx == 1)) {
    auVar8._8_2_ = 0x5a80;
    auVar8._0_8_ = 0x5a805a805a805a80;
    auVar8._10_2_ = 0x5a80;
    auVar8._12_2_ = 0x5a80;
    auVar8._14_2_ = 0x5a80;
    auVar8._16_2_ = 0x5a80;
    auVar8._18_2_ = 0x5a80;
    auVar8._20_2_ = 0x5a80;
    auVar8._22_2_ = 0x5a80;
    auVar8._24_2_ = 0x5a80;
    auVar8._26_2_ = 0x5a80;
    auVar8._28_2_ = 0x5a80;
    auVar8._30_2_ = 0x5a80;
    auVar10._8_2_ = 1;
    auVar10._0_8_ = 0x1000100010001;
    auVar10._10_2_ = 1;
    auVar10._12_2_ = 1;
    auVar10._14_2_ = 1;
    auVar10._16_2_ = 1;
    auVar10._18_2_ = 1;
    auVar10._20_2_ = 1;
    auVar10._22_2_ = 1;
    auVar10._24_2_ = 1;
    auVar10._26_2_ = 1;
    auVar10._28_2_ = 1;
    auVar10._30_2_ = 1;
    for (lVar4 = 0; lVar4 != 0x200; lVar4 = lVar4 + 0x20) {
      auVar9 = vlddqu_avx(*(undefined1 (*) [32])input);
      auVar9 = vpackssdw_avx2(auVar9,*(undefined1 (*) [32])((long)input + 0x20));
      auVar9 = vpermq_avx2(auVar9,0xd8);
      auVar9 = vpmulhrsw_avx2(auVar9,auVar8);
      auVar3 = vpunpcklwd_avx2(auVar9,auVar10);
      auVar2 = vpunpckhwd_avx2(auVar9,auVar10);
      auVar9 = vpmaddwd_avx2(auVar3,auVar7);
      auVar2 = vpmaddwd_avx2(auVar2,auVar7);
      auVar9 = vpsrad_avx2(auVar9,ZEXT416(uVar5));
      auVar2 = vpsrad_avx2(auVar2,ZEXT416(uVar5));
      auVar9 = vpackssdw_avx2(auVar9,auVar2);
      *(undefined1 (*) [32])((long)*out + lVar4) = auVar9;
      input = (int32_t *)(*(undefined1 (*) [32])input + (long)stride * 4);
    }
  }
  else {
    auVar9._8_2_ = 1;
    auVar9._0_8_ = 0x1000100010001;
    auVar9._10_2_ = 1;
    auVar9._12_2_ = 1;
    auVar9._14_2_ = 1;
    auVar9._16_2_ = 1;
    auVar9._18_2_ = 1;
    auVar9._20_2_ = 1;
    auVar9._22_2_ = 1;
    auVar9._24_2_ = 1;
    auVar9._26_2_ = 1;
    auVar9._28_2_ = 1;
    auVar9._30_2_ = 1;
    for (lVar4 = 0; lVar4 != 0x200; lVar4 = lVar4 + 0x20) {
      auVar8 = vlddqu_avx(*(undefined1 (*) [32])input);
      auVar8 = vpackssdw_avx2(auVar8,*(undefined1 (*) [32])((long)input + 0x20));
      auVar10 = vpermq_avx2(auVar8,0xd8);
      auVar8 = vpunpcklwd_avx2(auVar10,auVar9);
      auVar10 = vpunpckhwd_avx2(auVar10,auVar9);
      auVar8 = vpmaddwd_avx2(auVar8,auVar7);
      auVar10 = vpmaddwd_avx2(auVar10,auVar7);
      auVar8 = vpsrad_avx2(auVar8,ZEXT416(uVar5));
      auVar10 = vpsrad_avx2(auVar10,ZEXT416(uVar5));
      auVar8 = vpackssdw_avx2(auVar8,auVar10);
      *(undefined1 (*) [32])((long)*out + lVar4) = auVar8;
      input = (int32_t *)(*(undefined1 (*) [32])input + (long)stride * 4);
    }
  }
  return;
}

Assistant:

static inline void iidentity_row_16xn_avx2(__m256i *out, const int32_t *input,
                                           int stride, int shift, int height,
                                           int txw_idx, int rect_type) {
  const int32_t *input_row = input;
  const __m256i scale = _mm256_set1_epi16(NewSqrt2list[txw_idx]);
  const __m256i _r = _mm256_set1_epi16((1 << (NewSqrt2Bits - 1)) +
                                       (1 << (NewSqrt2Bits - shift - 1)));
  const __m256i one = _mm256_set1_epi16(1);
  const __m256i scale__r = _mm256_unpacklo_epi16(scale, _r);
  if (rect_type != 1 && rect_type != -1) {
    for (int i = 0; i < height; ++i) {
      const __m256i src = load_32bit_to_16bit_w16_avx2(input_row);
      input_row += stride;
      __m256i lo = _mm256_unpacklo_epi16(src, one);
      __m256i hi = _mm256_unpackhi_epi16(src, one);
      lo = _mm256_madd_epi16(lo, scale__r);
      hi = _mm256_madd_epi16(hi, scale__r);
      lo = _mm256_srai_epi32(lo, NewSqrt2Bits - shift);
      hi = _mm256_srai_epi32(hi, NewSqrt2Bits - shift);
      out[i] = _mm256_packs_epi32(lo, hi);
    }
  } else {
    const __m256i rect_scale =
        _mm256_set1_epi16(NewInvSqrt2 << (15 - NewSqrt2Bits));
    for (int i = 0; i < height; ++i) {
      __m256i src = load_32bit_to_16bit_w16_avx2(input_row);
      src = _mm256_mulhrs_epi16(src, rect_scale);
      input_row += stride;
      __m256i lo = _mm256_unpacklo_epi16(src, one);
      __m256i hi = _mm256_unpackhi_epi16(src, one);
      lo = _mm256_madd_epi16(lo, scale__r);
      hi = _mm256_madd_epi16(hi, scale__r);
      lo = _mm256_srai_epi32(lo, NewSqrt2Bits - shift);
      hi = _mm256_srai_epi32(hi, NewSqrt2Bits - shift);
      out[i] = _mm256_packs_epi32(lo, hi);
    }
  }
}